

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Processor::addSpecialisationParameter(Processor *this,VariableDeclaration *v)

{
  pool_ref<soul::AST::ASTObject> local_38 [3];
  pool_ref<soul::AST::VariableDeclaration> local_20;
  VariableDeclaration *local_18;
  VariableDeclaration *v_local;
  Processor *this_local;
  
  local_18 = v;
  v_local = (VariableDeclaration *)this;
  checkAssertion((bool)(v->isConstant & 1),"v.isConstant","addSpecialisationParameter",0x30c);
  pool_ref<soul::AST::VariableDeclaration>::pool_ref<soul::AST::VariableDeclaration,void>
            (&local_20,local_18);
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ::push_back(&this->stateVariables,&local_20);
  pool_ref<soul::AST::VariableDeclaration>::~pool_ref(&local_20);
  pool_ref<soul::AST::ASTObject>::pool_ref<soul::AST::VariableDeclaration,void>(local_38,local_18);
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  ::push_back(&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,local_38);
  pool_ref<soul::AST::ASTObject>::~pool_ref(local_38);
  return;
}

Assistant:

void addSpecialisationParameter (VariableDeclaration& v) override
        {
            SOUL_ASSERT (v.isConstant);
            stateVariables.push_back (v);
            specialisationParams.push_back (v);
        }